

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

void Ivy_ManHaigStart(Ivy_Man_t *p,int fVerbose)

{
  undefined4 uVar1;
  Vec_Ptr_t *p_00;
  Ivy_Man_t *pIVar2;
  uint *puVar3;
  undefined4 *puVar4;
  int i;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *local_38;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,99,"void Ivy_ManHaigStart(Ivy_Man_t *, int)");
  }
  pIVar2 = Ivy_ManDup(p);
  p->pHaig = pIVar2;
  if (fVerbose != 0) {
    printf("Starting : ");
    Ivy_ManPrintStats(p->pHaig);
  }
  puVar3 = (uint *)malloc(0x10);
  puVar3[0] = 100;
  puVar3[1] = 0;
  local_38 = malloc(400);
  *(void **)(puVar3 + 2) = local_38;
  uVar6 = 0;
  uVar5 = 100;
  i = 0;
  do {
    p_00 = p->pHaig->vObjs;
    if (p_00->nSize <= i) {
      p->pHaig->pData = puVar3;
      return;
    }
    puVar4 = (undefined4 *)Vec_PtrEntry(p_00,i);
    if ((puVar4 != (undefined4 *)0x0) && ((puVar4[2] & 0xf) == 4)) {
      puVar4[2] = puVar4[2] | 0x600;
      uVar1 = *puVar4;
      uVar7 = uVar6;
      if (uVar6 == uVar5) {
        uVar6 = uVar5 * 2;
        if ((int)uVar5 < 0x10) {
          uVar6 = 0x10;
        }
        uVar7 = uVar5;
        if ((int)uVar5 < (int)uVar6) {
          if (local_38 == (void *)0x0) {
            local_38 = malloc((ulong)uVar6 << 2);
          }
          else {
            local_38 = realloc(local_38,(ulong)uVar6 << 2);
          }
          *(void **)(puVar3 + 2) = local_38;
          if (local_38 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *puVar3 = uVar6;
          uVar7 = puVar3[1];
          uVar5 = uVar6;
        }
      }
      uVar6 = uVar7 + 1;
      puVar3[1] = uVar6;
      *(undefined4 *)((long)local_38 + (long)(int)uVar7 * 4) = uVar1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Ivy_ManHaigStart( Ivy_Man_t * p, int fVerbose )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig == NULL );
    p->pHaig = Ivy_ManDup( p );

    if ( fVerbose )
    {
        printf( "Starting : " );
        Ivy_ManPrintStats( p->pHaig );
    }

    // collect latches of design D and set their values to be DC
    vLatches = Vec_IntAlloc( 100 );
    Ivy_ManForEachLatch( p->pHaig, pObj, i )
    {
        pObj->Init = IVY_INIT_DC;
        Vec_IntPush( vLatches, pObj->Id );
    }
    p->pHaig->pData = vLatches;
/*
    {
        int x;
        Ivy_ManShow( p, 0, NULL );
        Ivy_ManShow( p->pHaig, 1, NULL );
        x = 0;
    }
*/
}